

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void __thiscall
duckdb::AggregateExecutor::
UnaryUpdate<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
          (AggregateExecutor *this,Vector *input,AggregateInputData *aggr_input_data,
          data_ptr_t state,idx_t count)

{
  undefined8 *puVar1;
  sel_t *psVar2;
  hugeint_t lhs;
  hugeint_t lhs_00;
  hugeint_t lhs_01;
  hugeint_t rhs;
  hugeint_t rhs_00;
  hugeint_t rhs_01;
  hugeint_t rhs_02;
  data_ptr_t pdVar3;
  ulong uVar4;
  ulong uVar5;
  data_ptr_t pdVar6;
  ulong uVar7;
  data_ptr_t pdVar8;
  hugeint_t hVar9;
  hugeint_t input_00;
  UnifiedVectorFormat idata;
  uint64_t in_stack_ffffffffffffff58;
  uint64_t in_stack_ffffffffffffff68;
  long lVar10;
  uint64_t uVar11;
  int64_t in_stack_ffffffffffffff70;
  ulong uVar12;
  UnifiedVectorFormat local_78;
  
  if (*this == (AggregateExecutor)0x0) {
    lVar10 = *(long *)(this + 0x20);
    FlatVector::VerifyFlatVector((Vector *)this);
    if ((data_ptr_t)0x3f < state + 0x3f) {
      uVar12 = (ulong)(state + 0x3f) >> 6;
      uVar11 = lVar10 + 8;
      uVar4 = 0;
      pdVar8 = (data_ptr_t)0x0;
      do {
        if (*(long *)(this + 0x28) == 0) {
          uVar7 = 0xffffffffffffffff;
        }
        else {
          uVar7 = *(ulong *)(*(long *)(this + 0x28) + uVar4 * 8);
        }
        pdVar3 = pdVar8 + 0x40;
        if (state <= pdVar8 + 0x40) {
          pdVar3 = state;
        }
        pdVar6 = pdVar3;
        if (uVar7 != 0) {
          pdVar6 = pdVar8;
          if (uVar7 == 0xffffffffffffffff) {
            if (pdVar8 < pdVar3) {
              *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
              do {
                lhs.upper = (int64_t)this;
                lhs.lower = in_stack_ffffffffffffff58;
                rhs.upper = uVar12;
                rhs.lower = uVar11;
                hVar9 = Hugeint::Add<true>(lhs,rhs);
                *(hugeint_t *)&aggr_input_data->allocator = hVar9;
                pdVar6 = pdVar6 + 1;
              } while (pdVar3 != pdVar6);
            }
          }
          else if (pdVar8 < pdVar3) {
            uVar5 = 0;
            do {
              if ((uVar7 >> (uVar5 & 0x3f) & 1) != 0) {
                *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
                hVar9.upper = (int64_t)this;
                hVar9.lower = in_stack_ffffffffffffff58;
                rhs_00.upper = uVar12;
                rhs_00.lower = uVar11;
                hVar9 = Hugeint::Add<true>(hVar9,rhs_00);
                *(hugeint_t *)&aggr_input_data->allocator = hVar9;
              }
              uVar5 = uVar5 + 1;
            } while (pdVar8 + (uVar5 - (long)pdVar3) != (data_ptr_t)0x0);
            pdVar6 = pdVar8 + uVar5;
          }
        }
        uVar4 = uVar4 + 1;
        pdVar8 = pdVar6;
      } while (uVar4 != uVar12);
    }
  }
  else if (*this == (AggregateExecutor)0x2) {
    if ((*(byte **)(this + 0x28) == (byte *)0x0) || ((**(byte **)(this + 0x28) & 1) != 0)) {
      puVar1 = *(undefined8 **)(this + 0x20);
      *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
      input_00.upper = (int64_t)state;
      input_00.lower = puVar1[1];
      HugeintAdd::AddConstant<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t>
                ((HugeintAdd *)aggr_input_data,(SumState<duckdb::hugeint_t> *)*puVar1,input_00,count
                );
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat((Vector *)this,(idx_t)state,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (state != (data_ptr_t)0x0) {
        pdVar8 = (data_ptr_t)0x0;
        do {
          *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
          lhs_01.upper = (int64_t)this;
          lhs_01.lower = in_stack_ffffffffffffff58;
          rhs_02.upper = in_stack_ffffffffffffff70;
          rhs_02.lower = in_stack_ffffffffffffff68;
          hVar9 = Hugeint::Add<true>(lhs_01,rhs_02);
          *(hugeint_t *)&aggr_input_data->allocator = hVar9;
          pdVar8 = pdVar8 + 1;
        } while (state != pdVar8);
      }
    }
    else if (state != (data_ptr_t)0x0) {
      psVar2 = (local_78.sel)->sel_vector;
      pdVar8 = (data_ptr_t)0x0;
      do {
        pdVar3 = pdVar8;
        if (psVar2 != (sel_t *)0x0) {
          pdVar3 = (data_ptr_t)(ulong)psVar2[(long)pdVar8];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [(ulong)pdVar3 >> 6] >> ((ulong)pdVar3 & 0x3f) & 1) != 0)) {
          *(undefined1 *)&(aggr_input_data->bind_data).ptr = 1;
          lhs_00.upper = (int64_t)this;
          lhs_00.lower = in_stack_ffffffffffffff58;
          rhs_01.upper = in_stack_ffffffffffffff70;
          rhs_01.lower = in_stack_ffffffffffffff68;
          hVar9 = Hugeint::Add<true>(lhs_00,rhs_01);
          *(hugeint_t *)&aggr_input_data->allocator = hVar9;
        }
        pdVar8 = pdVar8 + 1;
      } while (state != pdVar8);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}